

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O1

void __thiscall
CCheckQueue<FakeCheckCheckCompletion>::~CCheckQueue(CCheckQueue<FakeCheckCheckCompletion> *this)

{
  pointer ptVar1;
  pointer pFVar2;
  thread *t;
  pointer ptVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  unique_lock<std::mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_owns = false;
  local_38._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_38);
  this->m_request_stop = true;
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  std::condition_variable::notify_all();
  ptVar1 = (this->m_worker_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (ptVar3 = (this->m_worker_threads).
                super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->m_worker_threads);
  pFVar2 = (this->queue).
           super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pFVar2 != (pointer)0x0) {
    operator_delete(pFVar2,(long)(this->queue).
                                 super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar2);
  }
  std::condition_variable::~condition_variable(&this->m_master_cv);
  std::condition_variable::~condition_variable(&this->m_worker_cv);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CCheckQueue()
    {
        WITH_LOCK(m_mutex, m_request_stop = true);
        m_worker_cv.notify_all();
        for (std::thread& t : m_worker_threads) {
            t.join();
        }
    }